

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O3

void SRCTools::SincResampler::KaizerWindow::windowedSinc
               (FIRCoefficient *kernel,uint order,double fc,double beta,double amp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar9 = 1.0;
  dVar10 = beta * 0.5;
  dVar8 = dVar10 * dVar10;
  dVar6 = 0.0;
  if (0.0 < dVar8) {
    uVar2 = 2;
    dVar9 = dVar10;
    do {
      dVar6 = dVar6 + dVar8;
      dVar9 = dVar9 * (dVar10 / (double)uVar2);
      dVar8 = dVar9 * dVar9;
      uVar2 = uVar2 + 1;
    } while (dVar6 * 1.11e-16 < dVar8);
    dVar9 = dVar6 + 1.0;
  }
  if (-1 < (int)order) {
    lVar4 = 0;
    uVar2 = order;
    do {
      dVar6 = (1.0 / (double)order) * (double)(int)uVar2;
      dVar6 = SQRT(ABS(1.0 - dVar6 * dVar6)) * beta * 0.5;
      dVar8 = dVar6 * dVar6;
      dVar10 = 1.0;
      if (0.0 < dVar8) {
        dVar10 = 0.0;
        uVar3 = 2;
        dVar7 = dVar6;
        do {
          dVar10 = dVar10 + dVar8;
          dVar7 = dVar7 * (dVar6 / (double)uVar3);
          dVar8 = dVar7 * dVar7;
          uVar3 = uVar3 + 1;
        } while (dVar10 * 1.11e-16 < dVar8);
        dVar10 = dVar10 + 1.0;
      }
      dVar6 = 1.0;
      if (uVar2 != 0) {
        dVar8 = (double)(int)uVar2 * fc * 3.141592653589793;
        dVar6 = sin(dVar8);
        dVar6 = dVar6 / dVar8;
      }
      fVar5 = (float)(dVar10 * dVar6 * (((fc + fc) * amp) / dVar9));
      kernel[lVar4] = fVar5;
      kernel[order - (int)lVar4] = fVar5;
      lVar4 = lVar4 + 1;
      bVar1 = 1 < (int)uVar2;
      uVar2 = uVar2 - 2;
    } while (bVar1);
  }
  return;
}

Assistant:

void KaizerWindow::windowedSinc(FIRCoefficient kernel[], const unsigned int order, const double fc, const double beta, const double amp) {
	const double fc_pi = M_PI * fc;
	const double recipOrder = 1.0 / order;
	const double mult = 2.0 * fc * amp / bessel(beta);
	for (int i = order, j = 0; 0 <= i; i -= 2, ++j) {
		double xw = i * recipOrder;
		double win = bessel(beta * sqrt(fabs(1.0 - xw * xw)));
		double xs = i * fc_pi;
		double sinc = (i == 0) ? 1.0 : sin(xs) / xs;
		FIRCoefficient imp = FIRCoefficient(mult * sinc * win);
		kernel[j] = imp;
		kernel[order - j] = imp;
	}
}